

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.c
# Opt level: O0

_Bool cs_disasm_iter(csh ud,uint8_t **code,size_t *size,uint64_t *address,cs_insn *insn)

{
  byte bVar1;
  size_t local_588;
  size_t skipdata_bytes;
  SStream ss;
  _Bool r;
  MCInst mci;
  uint16_t insn_size;
  cs_struct *handle;
  cs_insn *insn_local;
  uint64_t *address_local;
  size_t *size_local;
  uint8_t **code_local;
  csh ud_local;
  
  if (ud == 0) {
    return false;
  }
  *(undefined4 *)(ud + 0x58) = 0;
  MCInst_Init((MCInst *)&ss.index);
  mci.flat_insn = (cs_insn *)*address;
  insn->address = *address;
  mci.Operands[0x2f].field_2 = (anon_union_8_3_2f11d3b5_for_MCOperand_3)insn;
  mci.address = ud;
  bVar1 = (**(code **)(ud + 0x18))
                    (ud,*code,*size,&ss.index,&mci.writeback,*address,*(undefined8 *)(ud + 0x20));
  ss.buffer[0x1ff] = bVar1 & 1;
  if (ss.buffer[0x1ff] == 0) {
    if (((*(byte *)(ud + 0x88) & 1) == 0) || (*size < (ulong)*(byte *)(ud + 0x89))) {
      return false;
    }
    if (*(long *)(ud + 0x98) == 0) {
      local_588 = (size_t)*(byte *)(ud + 0x89);
    }
    else {
      local_588 = (**(code **)(ud + 0x98))(*code,*size,0,*(undefined8 *)(ud + 0xa0));
      if (*size < local_588) {
        return false;
      }
      if (local_588 == 0) {
        return false;
      }
    }
    insn->id = 0;
    insn->address = *address;
    insn->size = (uint16_t)local_588;
    memcpy(insn->bytes,*code,local_588);
    strncpy(insn->mnemonic,*(char **)(ud + 0x90),0x1f);
    skipdata_opstr(insn->op_str,*code,local_588);
    *code = *code + local_588;
    *size = *size - local_588;
    *address = local_588 + *address;
  }
  else {
    SStream_Init((SStream *)&skipdata_bytes);
    *(undefined2 *)(mci.Operands[0x2f].field_2.ImmVal + 0x10) = mci._814_2_;
    (**(code **)(ud + 0x48))(ud,insn,mci.OpcodePub);
    (**(code **)(ud + 8))(&ss.index,&skipdata_bytes,*(undefined8 *)(ud + 0x10));
    fill_insn((cs_struct *)ud,insn,(char *)&skipdata_bytes,(MCInst *)&ss.index,
              *(PostPrinter_t *)(ud + 0x50),*code);
    *code = *code + (int)(uint)(ushort)mci._814_2_;
    *size = *size - (ulong)(ushort)mci._814_2_;
    *address = (ulong)(ushort)mci._814_2_ + *address;
  }
  return true;
}

Assistant:

CAPSTONE_EXPORT
bool cs_disasm_iter(csh ud, const uint8_t **code, size_t *size,
		uint64_t *address, cs_insn *insn)
{
	struct cs_struct *handle;
	uint16_t insn_size;
	MCInst mci;
	bool r;

	handle = (struct cs_struct *)(uintptr_t)ud;
	if (!handle) {
		return false;
	}

	handle->errnum = CS_ERR_OK;

	MCInst_Init(&mci);
	mci.csh = handle;

	// relative branches need to know the address & size of current insn
	mci.address = *address;

	// save all the information for non-detailed mode
	mci.flat_insn = insn;
	mci.flat_insn->address = *address;
#ifdef CAPSTONE_DIET
	// zero out mnemonic & op_str
	mci.flat_insn->mnemonic[0] = '\0';
	mci.flat_insn->op_str[0] = '\0';
#endif

	r = handle->disasm(ud, *code, *size, &mci, &insn_size, *address, handle->getinsn_info);
	if (r) {
		SStream ss;
		SStream_Init(&ss);

		mci.flat_insn->size = insn_size;

		// map internal instruction opcode to public insn ID
		handle->insn_id(handle, insn, mci.Opcode);

		handle->printer(&mci, &ss, handle->printer_info);

		fill_insn(handle, insn, ss.buffer, &mci, handle->post_printer, *code);

		*code += insn_size;
		*size -= insn_size;
		*address += insn_size;
	} else { 	// encounter a broken instruction
		size_t skipdata_bytes;

		// if there is no request to skip data, or remaining data is too small,
		// then bail out
		if (!handle->skipdata || handle->skipdata_size > *size)
			return false;

		if (handle->skipdata_setup.callback) {
			skipdata_bytes = handle->skipdata_setup.callback(*code, *size,
					0, handle->skipdata_setup.user_data);
			if (skipdata_bytes > *size)
				// remaining data is not enough
				return false;

			if (!skipdata_bytes)
				// user requested not to skip data, so bail out
				return false;
		} else
			skipdata_bytes = handle->skipdata_size;

		// we have to skip some amount of data, depending on arch & mode
		insn->id = 0;	// invalid ID for this "data" instruction
		insn->address = *address;
		insn->size = (uint16_t)skipdata_bytes;
		memcpy(insn->bytes, *code, skipdata_bytes);
		strncpy(insn->mnemonic, handle->skipdata_setup.mnemonic,
				sizeof(insn->mnemonic) - 1);
		skipdata_opstr(insn->op_str, *code, skipdata_bytes);

		*code += skipdata_bytes;
		*size -= skipdata_bytes;
		*address += skipdata_bytes;
	}

	return true;
}